

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O2

void __thiscall
hwtest::pgraph::MthdCelsiusLineSmoothEnable::emulate_mthd(MthdCelsiusLineSmoothEnable *this)

{
  pgraph_state *state;
  uint uVar1;
  uint err;
  
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  pgraph_celsius_pre_icmd(state);
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.val;
  err = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_config_c >> 6 & 4 |
        (uint)(1 < uVar1);
  if (err != 0) {
    MthdTest::warn((MthdTest *)this,err);
    return;
  }
  if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource & 2) == 0) {
    uVar1 = (uVar1 & 1) << 10 |
            (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_raster &
            0xfffffbff;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_raster = uVar1;
    pgraph_celsius_icmd(state,0x22,uVar1,true);
    return;
  }
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_celsius_pre_icmd(&exp);
		uint32_t err = 0;
		if (val > 1)
			err |= 1;
		if (extr(exp.celsius_config_c, 8, 1))
			err |= 4;
		if (err) {
			warn(err);
		} else {
			if (!extr(exp.nsource, 1, 1)) {
				insrt(exp.bundle_raster, 10, 1, val);
				pgraph_celsius_icmd(&exp, 0x22, exp.bundle_raster, true);
			}
		}
	}